

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<void_(double,_double,_mp::var::Type)>::Matches
          (TypedExpectation<void_(double,_double,_mp::var::Type)> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
                    ((tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                      *)(this + 0xf0),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x140) + 0x20))(*(long **)(this + 0x140),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }